

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * perfetto::base::ToLower(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator c;
  iterator end;
  string *str_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  c._M_current = (char *)::std::__cxx11::string::end();
  local_30._M_current = (char *)::std::__cxx11::string::begin();
  while (bVar1 = __gnu_cxx::operator!=(&local_30,&c), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    cVar2 = Lowercase(*pcVar3);
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    *pcVar3 = cVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToLower(const std::string& str) {
  // Don't use tolower(), it depends on the locale.
  std::string res(str);
  auto end = res.end();
  for (auto c = res.begin(); c != end; ++c)
    *c = Lowercase(*c);
  return res;
}